

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringView.cpp
# Opt level: O0

Array3<BasicStringView<char>_> * __thiscall
Corrade::Containers::BasicStringView<char>::partition
          (Array3<BasicStringView<char>_> *__return_storage_ptr__,BasicStringView<char> *this,
          StringView separator)

{
  BasicStringView<char> local_78;
  BasicStringView<char> local_68;
  BasicStringView<char> local_58;
  char *local_48;
  char *pos;
  size_t size;
  size_t separatorSize;
  char *separatorData;
  BasicStringView<char> *this_local;
  StringView separator_local;
  
  separator_local._data = (char *)separator._sizePlusFlags;
  this_local = (BasicStringView<char> *)separator._data;
  separatorData = (char *)this;
  separator_local._sizePlusFlags = (size_t)__return_storage_ptr__;
  separatorSize =
       (size_t)BasicStringView<const_char>::data((BasicStringView<const_char> *)&this_local);
  size = BasicStringView<const_char>::size((BasicStringView<const_char> *)&this_local);
  pos = (char *)BasicStringView<char>::size(this);
  local_48 = Implementation::stringFindString(this->_data,(size_t)pos,(char *)separatorSize,size);
  if (local_48 == (char *)0x0) {
    local_58 = *this;
  }
  else {
    local_58 = prefix<char_*,_0>(this,local_48);
  }
  if (local_48 == (char *)0x0) {
    local_68 = exceptPrefix(this,(size_t)pos);
  }
  else {
    local_68 = slice(this,local_48,local_48 + size);
  }
  if (local_48 == (char *)0x0) {
    local_78 = exceptPrefix(this,(size_t)pos);
  }
  else {
    local_78 = suffix(this,local_48 + size);
  }
  StaticArray<3UL,_Corrade::Containers::BasicStringView<char>_>::
  StaticArray<const_Corrade::Containers::BasicStringView<char>,_Corrade::Containers::BasicStringView<char>,_Corrade::Containers::BasicStringView<char>,_0>
            (__return_storage_ptr__,&local_58,&local_68,&local_78);
  return __return_storage_ptr__;
}

Assistant:

Array3<BasicStringView<T>> BasicStringView<T>::partition(const StringView separator) const {
    /** @todo use findOr(StringView) for this, this has an awful lot of
        branches */

    const char* const separatorData = separator.data();
    const std::size_t separatorSize = separator.size();
    const std::size_t size = this->size();
    T* const pos = const_cast<T*>(Implementation::stringFindString(_data, size, separatorData, separatorSize));
    return {
        pos ? prefix(pos) : *this,
        pos ? slice(pos, pos + separatorSize) : exceptPrefix(size),
        pos ? suffix(pos + separatorSize) : exceptPrefix(size)
    };
}